

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_group_norm(ggml_context *ctx,ggml_tensor *a,int n_groups,float eps)

{
  ggml_tensor *pgVar1;
  undefined8 in_RDI;
  
  pgVar1 = ggml_group_norm_impl(ctx,a,n_groups,eps,SUB81((ulong)in_RDI >> 0x38,0));
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_group_norm(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_groups,
        float                 eps) {
    return ggml_group_norm_impl(ctx, a, n_groups, eps, false);
}